

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::identifier_expression::~identifier_expression(identifier_expression *this)

{
  identifier_expression *this_local;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__identifier_expression_002b0350;
  std::__cxx11::wstring::~wstring((wstring *)&this->id_);
  expression::~expression(&this->super_expression);
  return;
}

Assistant:

explicit identifier_expression(const source_extend& extend, const std::wstring& id) : expression(extend), id_(id) {}